

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<void_*> * __thiscall
kj::_::ExceptionOr<void_*>::operator=(ExceptionOr<void_*> *this,ExceptionOr<void_*> *param_1)

{
  ExceptionOr<void_*> *param_1_local;
  ExceptionOr<void_*> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<void_*>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;